

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseReaction::MarkVisitPtrs
          (JavascriptPromiseReaction *this,SnapshotExtractor *extractor)

{
  RecyclableObject **ppRVar1;
  JavascriptPromiseCapability **ppJVar2;
  JavascriptPromiseCapability *this_00;
  SnapshotExtractor *extractor_local;
  JavascriptPromiseReaction *this_local;
  
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->handler);
  if (*ppRVar1 != (RecyclableObject *)0x0) {
    ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromiseCapability__
                        ((WriteBarrierPtr *)&this->capabilities);
    if (*ppJVar2 != (JavascriptPromiseCapability *)0x0) {
      ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                          ((WriteBarrierPtr *)&this->handler);
      TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppRVar1);
      this_00 = Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::operator->
                          (&this->capabilities);
      JavascriptPromiseCapability::MarkVisitPtrs(this_00,extractor);
      return;
    }
  }
  TTDAbort_unrecoverable_error("Seems odd, I was not expecting this!!!");
}

Assistant:

void JavascriptPromiseReaction::MarkVisitPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->handler != nullptr && this->capabilities != nullptr, "Seems odd, I was not expecting this!!!");

        extractor->MarkVisitVar(this->handler);

        this->capabilities->MarkVisitPtrs(extractor);
    }